

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O1

void jpeg_fdct_8x4(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  DCTELEM *pDVar4;
  int *piVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  uint uVar27;
  int iVar28;
  int iVar51;
  ulong uVar29;
  undefined1 auVar30 [16];
  ulong uVar33;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  uint uVar52;
  undefined1 auVar34 [16];
  uint uVar53;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ulong uVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  uint uVar42;
  int iVar43;
  int iVar54;
  undefined1 auVar44 [16];
  uint uVar45;
  int iVar46;
  uint uVar47;
  int iVar49;
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  ulong uVar35;
  
  *(undefined1 (*) [16])(data + 0x3c) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(data + 0x38) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(data + 0x34) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(data + 0x30) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(data + 0x2c) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(data + 0x28) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(data + 0x24) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(data + 0x20) = (undefined1  [16])0x0;
  uVar29 = (ulong)start_col;
  lVar16 = 0;
  do {
    lVar15 = *(long *)((long)sample_data + lVar16);
    bVar6 = *(byte *)(lVar15 + 7 + uVar29);
    uVar25 = (uint)*(byte *)(lVar15 + uVar29) + (uint)bVar6;
    bVar7 = *(byte *)(lVar15 + 1 + uVar29);
    bVar8 = *(byte *)(lVar15 + 6 + uVar29);
    uVar18 = (uint)bVar7 + (uint)bVar8;
    bVar9 = *(byte *)(lVar15 + 2 + uVar29);
    bVar10 = *(byte *)(lVar15 + 5 + uVar29);
    uVar27 = (uint)bVar9 + (uint)bVar10;
    bVar11 = *(byte *)(lVar15 + 3 + uVar29);
    bVar12 = *(byte *)(lVar15 + 4 + uVar29);
    uVar21 = (uint)bVar11 + (uint)bVar12;
    lVar19 = (ulong)uVar25 - (ulong)uVar21;
    iVar22 = uVar21 + uVar25;
    lVar26 = (ulong)uVar18 - (ulong)uVar27;
    iVar28 = uVar27 + uVar18;
    lVar24 = (ulong)*(byte *)(lVar15 + uVar29) - (ulong)bVar6;
    lVar23 = (ulong)bVar7 - (ulong)bVar8;
    lVar20 = (ulong)bVar9 - (ulong)bVar10;
    lVar15 = (ulong)bVar11 - (ulong)bVar12;
    data[lVar16] = (iVar22 + iVar28) * 8 + -0x2000;
    data[lVar16 + 4] = (iVar22 - iVar28) * 8;
    lVar17 = (lVar19 + lVar26) * 0x1151;
    data[lVar16 + 2] = (DCTELEM)(lVar19 * 0x187e + lVar17 + 0x200U >> 10);
    data[lVar16 + 6] = (DCTELEM)(lVar17 + lVar26 * 0x3ffffffc4df + 0x200U >> 10);
    lVar19 = (lVar15 + lVar23 + lVar20 + lVar24) * 0x25a1;
    lVar17 = (lVar20 + lVar24) * -0xc7c + lVar19 + 0x200;
    lVar19 = lVar19 + (lVar15 + lVar23) * -0x3ec5 + 0x200;
    lVar26 = (lVar15 + lVar24) * -0x1ccd;
    data[lVar16 + 1] = (DCTELEM)((ulong)(lVar24 * 0x300b + lVar26 + lVar17) >> 10);
    lVar24 = (lVar20 + lVar23) * -0x5203;
    data[lVar16 + 3] = (DCTELEM)((ulong)(lVar23 * 0x6254 + lVar24 + lVar19) >> 10);
    data[lVar16 + 5] = (DCTELEM)((ulong)(lVar20 * 0x41b3 + lVar24 + lVar17) >> 10);
    data[lVar16 + 7] = (DCTELEM)((ulong)(lVar15 * 0x98e + lVar26 + lVar19) >> 10);
    lVar16 = lVar16 + 8;
  } while (lVar16 != 0x20);
  lVar16 = -8;
  do {
    piVar1 = data + lVar16 + 8;
    piVar2 = data + lVar16 + 0x10;
    piVar3 = data + lVar16 + 0x18;
    piVar5 = data + lVar16 + 0x20;
    iVar54 = *piVar5 + *piVar1;
    auVar44._4_4_ = piVar5[1] + piVar1[1];
    iVar22 = piVar5[2] + piVar1[2];
    iVar28 = piVar5[3] + piVar1[3];
    auVar50._4_4_ = iVar28;
    auVar50._0_4_ = iVar22;
    auVar50._8_4_ = iVar28;
    auVar50._12_4_ = -(uint)(iVar28 < 0);
    auVar44._8_4_ = auVar44._4_4_;
    auVar44._12_4_ = -(uint)(auVar44._4_4_ < 0);
    lVar17 = CONCAT44(-(uint)(iVar54 < 0),iVar54) + 2;
    lVar19 = auVar44._8_8_ + 2;
    lVar20 = CONCAT44(-(uint)(iVar22 < 0),iVar22) + 2;
    lVar23 = auVar50._8_8_ + 2;
    iVar51 = *piVar3 + *piVar2;
    auVar30._4_4_ = piVar3[1] + piVar2[1];
    iVar22 = piVar3[2] + piVar2[2];
    iVar28 = piVar3[3] + piVar2[3];
    auVar48._4_4_ = iVar28;
    auVar48._0_4_ = iVar22;
    auVar30._8_4_ = auVar30._4_4_;
    auVar30._12_4_ = -(uint)(auVar30._4_4_ < 0);
    lVar15 = CONCAT44(-(uint)(iVar51 < 0),iVar51);
    auVar48._8_4_ = iVar28;
    auVar48._12_4_ = -(uint)(iVar28 < 0);
    lVar24 = CONCAT44(-(uint)(iVar22 < 0),iVar22);
    uVar53 = *piVar1 - *piVar5;
    auVar36._4_4_ = piVar1[1] - piVar5[1];
    uVar25 = piVar1[2] - piVar5[2];
    iVar22 = piVar1[3] - piVar5[3];
    auVar41._4_4_ = iVar22;
    auVar41._0_4_ = uVar25;
    uVar42 = -(uint)((int)uVar25 < 0);
    iVar43 = -(uint)(iVar22 < 0);
    auVar41._8_4_ = iVar22;
    auVar41._12_4_ = iVar43;
    uVar45 = -(uint)((int)uVar53 < 0);
    iVar46 = -(uint)(auVar36._4_4_ < 0);
    auVar36._8_4_ = auVar36._4_4_;
    auVar36._12_4_ = iVar46;
    uVar52 = *piVar2 - *piVar3;
    auVar34._4_4_ = piVar2[1] - piVar3[1];
    uVar18 = piVar2[2] - piVar3[2];
    uVar21 = piVar2[3] - piVar3[3];
    pDVar4 = data + lVar16 + 8;
    *pDVar4 = (DCTELEM)((ulong)(lVar17 + lVar15) >> 2);
    pDVar4[1] = (DCTELEM)((ulong)(lVar19 + auVar30._8_8_) >> 2);
    pDVar4[2] = (DCTELEM)((ulong)(lVar20 + lVar24) >> 2);
    pDVar4[3] = (DCTELEM)((ulong)(lVar23 + auVar48._8_8_) >> 2);
    uVar27 = -(uint)((int)uVar18 < 0);
    iVar28 = -(uint)((int)uVar21 < 0);
    uVar47 = -(uint)((int)uVar52 < 0);
    iVar49 = -(uint)(auVar34._4_4_ < 0);
    auVar34._8_4_ = auVar34._4_4_;
    auVar34._12_4_ = iVar49;
    uVar35 = auVar34._8_8_;
    pDVar4 = data + lVar16 + 0x18;
    *pDVar4 = (DCTELEM)((ulong)(lVar17 - lVar15) >> 2);
    pDVar4[1] = (DCTELEM)((ulong)(lVar19 - auVar30._8_8_) >> 2);
    pDVar4[2] = (DCTELEM)((ulong)(lVar20 - lVar24) >> 2);
    pDVar4[3] = (DCTELEM)((ulong)(lVar23 - auVar48._8_8_) >> 2);
    uVar29 = CONCAT44(uVar47,uVar52) + CONCAT44(uVar45,uVar53);
    uVar33 = uVar35 + auVar36._8_8_;
    auVar13._8_4_ = uVar21;
    auVar13._0_8_ = CONCAT44(uVar27,uVar18);
    auVar13._12_4_ = iVar28;
    uVar39 = CONCAT44(uVar27,uVar18) + CONCAT44(uVar42,uVar25);
    uVar40 = auVar13._8_8_ + auVar41._8_8_;
    lVar15 = (uVar29 & 0xffffffff) * 0x1151 + 0x4000 + ((uVar29 >> 0x20) * 0x1151 << 0x20);
    lVar17 = (uVar33 & 0xffffffff) * 0x1151 + 0x4000 + ((uVar33 >> 0x20) * 0x1151 << 0x20);
    lVar19 = (uVar39 & 0xffffffff) * 0x1151 + 0x4000 + ((uVar39 >> 0x20) * 0x1151 << 0x20);
    lVar24 = (uVar40 & 0xffffffff) * 0x1151 + 0x4000 + ((uVar40 >> 0x20) * 0x1151 << 0x20);
    auVar31._4_4_ = iVar46;
    auVar31._0_4_ = uVar45;
    auVar31._8_4_ = iVar46;
    auVar31._12_4_ = -(uint)(iVar22 < 0);
    auVar37._4_4_ = iVar43;
    auVar37._0_4_ = uVar42;
    auVar37._8_4_ = iVar43;
    auVar37._12_4_ = -(uint)(iVar22 < 0);
    pDVar4 = data + lVar16 + 0x10;
    *pDVar4 = (DCTELEM)(((ulong)uVar45 * 0x187e << 0x20) + (ulong)uVar53 * 0x187e + lVar15 >> 0xf);
    pDVar4[1] = (DCTELEM)(((auVar31._8_8_ & 0xffffffff) * 0x187e << 0x20) +
                          (auVar36._8_8_ & 0xffffffff) * 0x187e + lVar17 >> 0xf);
    pDVar4[2] = (DCTELEM)(((ulong)uVar42 * 0x187e << 0x20) + (ulong)uVar25 * 0x187e + lVar19 >> 0xf)
    ;
    pDVar4[3] = (DCTELEM)(((auVar37._8_8_ & 0xffffffff) * 0x187e << 0x20) +
                          (auVar41._8_8_ & 0xffffffff) * 0x187e + lVar24 >> 0xf);
    auVar32._4_4_ = iVar49;
    auVar32._0_4_ = uVar47;
    auVar32._8_4_ = iVar49;
    auVar32._12_4_ = -(uint)((int)uVar21 < 0);
    auVar14._4_4_ = uVar27;
    auVar14._0_4_ = uVar18;
    auVar14._8_4_ = uVar21;
    auVar14._12_4_ = iVar28;
    auVar38._4_4_ = iVar28;
    auVar38._0_4_ = uVar27;
    auVar38._8_4_ = iVar28;
    auVar38._12_4_ = -(uint)((int)uVar21 < 0);
    pDVar4 = data + lVar16 + 0x20;
    *pDVar4 = (DCTELEM)(((ulong)uVar47 * 0xffffc4df + (ulong)uVar52 * 0x7fff << 0x20) +
                        (ulong)uVar52 * 0xffffc4df + lVar15 >> 0xf);
    pDVar4[1] = (DCTELEM)(((auVar32._8_8_ & 0xffffffff) * 0xffffc4df +
                           (uVar35 & 0xffffffff) * 0x7fff << 0x20) +
                          (uVar35 & 0xffffffff) * 0xffffc4df + lVar17 >> 0xf);
    pDVar4[2] = (DCTELEM)(((ulong)uVar27 * 0xffffc4df + (ulong)uVar18 * 0x7fff << 0x20) +
                          (ulong)uVar18 * 0xffffc4df + lVar19 >> 0xf);
    pDVar4[3] = (DCTELEM)(((auVar38._8_8_ & 0xffffffff) * 0xffffc4df + (ulong)uVar21 * 0x7fff <<
                          0x20) + (auVar14._8_8_ & 0xffffffff) * 0xffffc4df + lVar24 >> 0xf);
    lVar16 = lVar16 + 4;
  } while (lVar16 != 0);
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_8x4 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3;
  INT32 tmp10, tmp11, tmp12, tmp13;
  INT32 z1;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Zero 4 bottom rows of output coefficient block. */
  MEMZERO(&data[DCTSIZE*4], SIZEOF(DCTELEM) * DCTSIZE * 4);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* We must also scale the output by 8/4 = 2, which we add here. */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[4]);

    tmp10 = tmp0 + tmp3;
    tmp12 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp13 = tmp1 - tmp2;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[4]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 - 8 * CENTERJSAMPLE) << (PASS1_BITS+1));
    dataptr[4] = (DCTELEM) ((tmp10 - tmp11) << (PASS1_BITS+1));

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS-PASS1_BITS-2);
    dataptr[2] = (DCTELEM) RIGHT_SHIFT(z1 + MULTIPLY(tmp12, FIX_0_765366865),
				       CONST_BITS-PASS1_BITS-1);
    dataptr[6] = (DCTELEM) RIGHT_SHIFT(z1 - MULTIPLY(tmp13, FIX_1_847759065),
				       CONST_BITS-PASS1_BITS-1);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * 8-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/16).
     * i0..i3 in the paper are tmp0..tmp3 here.
     */

    tmp10 = tmp0 + tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp1 + tmp3;
    z1 = MULTIPLY(tmp12 + tmp13, FIX_1_175875602); /*  c3 */
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS-PASS1_BITS-2);

    tmp0  = MULTIPLY(tmp0,    FIX_1_501321110);    /*  c1+c3-c5-c7 */
    tmp1  = MULTIPLY(tmp1,    FIX_3_072711026);    /*  c1+c3+c5-c7 */
    tmp2  = MULTIPLY(tmp2,    FIX_2_053119869);    /*  c1+c3-c5+c7 */
    tmp3  = MULTIPLY(tmp3,    FIX_0_298631336);    /* -c1+c3+c5-c7 */
    tmp10 = MULTIPLY(tmp10, - FIX_0_899976223);    /*  c7-c3 */
    tmp11 = MULTIPLY(tmp11, - FIX_2_562915447);    /* -c1-c3 */
    tmp12 = MULTIPLY(tmp12, - FIX_0_390180644);    /*  c5-c3 */
    tmp13 = MULTIPLY(tmp13, - FIX_1_961570560);    /* -c3-c5 */

    tmp12 += z1;
    tmp13 += z1;

    dataptr[1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + tmp10 + tmp12, CONST_BITS-PASS1_BITS-1);
    dataptr[3] = (DCTELEM)
      RIGHT_SHIFT(tmp1 + tmp11 + tmp13, CONST_BITS-PASS1_BITS-1);
    dataptr[5] = (DCTELEM)
      RIGHT_SHIFT(tmp2 + tmp11 + tmp12, CONST_BITS-PASS1_BITS-1);
    dataptr[7] = (DCTELEM)
      RIGHT_SHIFT(tmp3 + tmp10 + tmp13, CONST_BITS-PASS1_BITS-1);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * 4-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/16).
   */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*3] + (ONE << (PASS1_BITS-1));
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*2];

    tmp10 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*3];
    tmp11 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*2];

    dataptr[DCTSIZE*0] = (DCTELEM) RIGHT_SHIFT(tmp0 + tmp1, PASS1_BITS);
    dataptr[DCTSIZE*2] = (DCTELEM) RIGHT_SHIFT(tmp0 - tmp1, PASS1_BITS);

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);   /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS+PASS1_BITS-1);

    dataptr[DCTSIZE*1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}